

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerset.c
# Opt level: O0

int nn_timerset_add(nn_timerset *self,int timeout,nn_timerset_hndl *hndl)

{
  uint uVar1;
  uint64_t uVar2;
  nn_list *pnVar3;
  long in_RDX;
  int in_ESI;
  nn_list *in_RDI;
  int first;
  nn_timerset_hndl *ith;
  nn_list_item *it;
  nn_list_item *in_stack_ffffffffffffffb8;
  nn_list *in_stack_ffffffffffffffc0;
  nn_list *item;
  undefined4 in_stack_ffffffffffffffd0;
  nn_list *local_20;
  
  uVar2 = nn_clock_ms();
  *(uint64_t *)(in_RDX + 0x10) = uVar2 + (long)in_ESI;
  local_20 = (nn_list *)nn_list_begin(in_RDI);
  while (item = local_20, pnVar3 = (nn_list *)nn_list_end(in_RDI), item != pnVar3) {
    in_stack_ffffffffffffffc0 = local_20;
    if (local_20 == (nn_list *)0x0) {
      in_stack_ffffffffffffffc0 = (nn_list *)0x0;
    }
    if (*(nn_list_item **)(in_RDX + 0x10) < in_stack_ffffffffffffffc0[1].first) break;
    local_20 = (nn_list *)nn_list_next(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  pnVar3 = (nn_list *)nn_list_begin(in_RDI);
  uVar1 = (uint)(pnVar3 == local_20);
  nn_list_insert((nn_list *)(ulong)CONCAT14(pnVar3 == local_20,in_stack_ffffffffffffffd0),
                 (nn_list_item *)item,(nn_list_item *)in_stack_ffffffffffffffc0);
  return uVar1;
}

Assistant:

int nn_timerset_add (struct nn_timerset *self, int timeout,
    struct nn_timerset_hndl *hndl)
{
    struct nn_list_item *it;
    struct nn_timerset_hndl *ith;
    int first;

    /*  Compute the instant when the timeout will be due. */
    hndl->timeout = nn_clock_ms()  + timeout;

    /*  Insert it into the ordered list of timeouts. */
    for (it = nn_list_begin (&self->timeouts);
          it != nn_list_end (&self->timeouts);
          it = nn_list_next (&self->timeouts, it)) {
        ith = nn_cont (it, struct nn_timerset_hndl, list);
        if (hndl->timeout < ith->timeout)
            break;
    }

    /*  If the new timeout happens to be the first one to expire, let the user
        know that the current waiting interval has to be changed. */
    first = nn_list_begin (&self->timeouts) == it ? 1 : 0;
    nn_list_insert (&self->timeouts, &hndl->list, it);
    return first;
}